

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
AddBotsIRCCommand::trigger
          (AddBotsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  size_type sVar7;
  long *plVar8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  split_parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  container_type local_60;
  long *local_48;
  long *local_40;
  long local_38;
  
  pcVar4 = channel._M_str;
  sVar5 = channel._M_len;
  lVar2 = Jupiter::IRC::Client::getChannel(source,sVar5,pcVar4,pcVar4,nick._M_len,nick._M_str);
  if (lVar2 == 0) {
    return;
  }
  RenX::getCore();
  Jupiter::IRC::Client::getChannel(source,sVar5,pcVar4);
  Jupiter::IRC::Client::Channel::getType();
  RenX::Core::getServers((int)&local_48);
  if (local_48 == local_40) {
    Jupiter::IRC::Client::sendMessage
              (source,sVar5,pcVar4,0x40,
               "Error: Channel not attached to any connected Renegade X servers.");
    goto LAB_0012ea2a;
  }
  jessilib::
  word_split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
            (&local_60,parameters._M_str,parameters._M_str + parameters._M_len," \t","");
  if (local_60.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_60.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = 1;
    local_60.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_60.
         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
LAB_0012e88b:
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    if ((ulong)((long)local_60.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_60.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
      sVar7 = 8;
      pcVar4 = "addbots ";
LAB_0012e8e4:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_a0,0,local_a0._M_string_length,pcVar4,sVar7);
    }
    else {
      uVar1 = RenX::getTeam(local_60.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_len);
      if (uVar1 < 4) {
        pcVar4 = &DAT_0013a7b8 + *(int *)(&DAT_0013a7b8 + (ulong)uVar1 * 4);
        sVar7 = *(size_type *)(&DAT_0013e060 + (ulong)uVar1 * 8);
        goto LAB_0012e8e4;
      }
    }
    if (local_48 != local_40) {
      plVar8 = local_48;
      do {
        sVar7 = local_a0._M_string_length;
        if (*plVar8 == 0) {
          lVar2 = 0;
        }
        else {
          string_printf_abi_cxx11_(&local_80,"%u",uVar6);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_a0,local_80._M_dataplus._M_p,local_80._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          RenX::Server::send(*plVar8,local_a0._M_string_length,local_a0._M_dataplus._M_p);
          if (local_a0._M_string_length < sVar7) {
            uVar3 = std::__throw_out_of_range_fmt
                              ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                               "basic_string::erase",sVar7);
            if (local_48 != (long *)0x0) {
              operator_delete(local_48,local_38 - (long)local_48);
            }
            _Unwind_Resume(uVar3);
          }
          local_a0._M_dataplus._M_p[sVar7] = '\0';
          lVar2 = *plVar8;
        }
        local_a0._M_string_length = sVar7;
        string_printf_abi_cxx11_(&local_80,"%u bots have been added to the server.",uVar6);
        RenX::Server::sendMessage(lVar2,local_80._M_string_length,local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        plVar8 = plVar8 + 1;
      } while (plVar8 != local_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    uVar1 = Jupiter_strtoi_s((local_60.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_str,
                             (local_60.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_len,0);
    uVar6 = (ulong)uVar1;
    if (uVar1 != 0) goto LAB_0012e88b;
    Jupiter::IRC::Client::sendMessage
              (source,sVar5,pcVar4,0x41,
               "Error: Invalid amount entered. Amount must be a positive integer.");
  }
  if (local_60.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0012ea2a:
  if (local_48 != (long *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return;
}

Assistant:

void AddBotsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(source->getChannel(channel)->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	int amount = 1;
	std::vector<std::string_view> split_parameters = jessilib::word_split_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.empty()) {
		amount = Jupiter::asInt(split_parameters.front());
		if (amount == 0) {
			source->sendMessage(channel, "Error: Invalid amount entered. Amount must be a positive integer."sv);
			return;
		}
	}

	std::string cmd;
	RenX::TeamType team = RenX::TeamType::None;
	if (split_parameters.size() >= 2) {
		team = RenX::getTeam(split_parameters[1]);
	}

	switch (team) {
	case RenX::TeamType::GDI:
		cmd = "addredbots ";
		break;
	case RenX::TeamType::Nod:
		cmd = "addbluebots ";
		break;
	case RenX::TeamType::None:
	case RenX::TeamType::Other:
		cmd = "addbots ";
		break;
	}

	for (const auto& server : servers) {
		size_t base_length = cmd.size();
		if (server != nullptr) {
			cmd += string_printf("%u", amount);
			server->send(cmd);
			cmd.erase(base_length);
		}
		server->sendMessage(string_printf("%u bots have been added to the server.", amount));
	}
}